

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O0

void __thiscall webrtc::EchoControlMobileImpl::Canceller::Canceller(Canceller *this)

{
  void *pvVar1;
  ostream *poVar2;
  FatalMessage local_190;
  FatalMessageVoidify local_11;
  Canceller *local_10;
  Canceller *this_local;
  
  local_10 = this;
  pvVar1 = WebRtcAecm_Create();
  this->state_ = pvVar1;
  if (this->state_ != (void *)0x0) {
    return;
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(&local_11);
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
             ,0x55);
  poVar2 = rtc::FatalMessage::stream(&local_190);
  poVar2 = std::operator<<(poVar2,"Check failed: state_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"# ");
  rtc::FatalMessageVoidify::operator&(&local_11,poVar2);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

Canceller() {
    state_ = WebRtcAecm_Create();
    RTC_CHECK(state_);
  }